

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtoull.c
# Opt level: O1

int main(void)

{
  int *piVar1;
  ulonglong uVar2;
  char *endptr;
  char tricky [5];
  char overflow [55];
  char *local_58;
  char local_50 [8];
  char local_48 [56];
  
  builtin_strncpy(local_48,"-ZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZ_",0x37);
  builtin_strncpy(local_50,"+0xz",5);
  piVar1 = __errno_location();
  *piVar1 = 0;
  uVar2 = strtoull(local_50,&local_58,0);
  if (uVar2 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/strtoull.c, line %d - %s\n"
           ,0x40,"strtoull( tricky, &endptr, 0 ) == 0");
  }
  uVar2 = strtoull(local_50,&local_58,8);
  if (uVar2 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/strtoull.c, line %d - %s\n"
           ,0x44,"strtoull( tricky, &endptr, 8 ) == 0");
  }
  if (local_58 != local_50 + 2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/strtoull.c, line %d - %s\n"
           ,0x45,"endptr == tricky + 2");
  }
  if (*piVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/strtoull.c, line %d - %s\n"
           ,0x47,"errno == 0");
  }
  local_58 = "";
  if (*piVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/strtoull.c, line %d - %s\n"
           ,0x4b,"errno == 0");
  }
  uVar2 = strtoull(local_48,&local_58,0x24);
  if (uVar2 != 0xffffffffffffffff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/strtoull.c, line %d - %s\n"
           ,0x4d,"strtoull( overflow, &endptr, 36 ) == ULLONG_MAX");
  }
  if (*piVar1 != 0x22) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/strtoull.c, line %d - %s\n"
           ,0x4e,"errno == ERANGE");
  }
  if ((long)local_58 - (long)local_48 != 0x35) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/strtoull.c, line %d - %s\n"
           ,0x4f,"( endptr - overflow ) == 53");
  }
  *piVar1 = 0;
  uVar2 = strtoull(local_48 + 1,&local_58,0x24);
  if (uVar2 != 0xffffffffffffffff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/strtoull.c, line %d - %s\n"
           ,0x52,"strtoull( overflow + 1, &endptr, 36 ) == ULLONG_MAX");
  }
  if (*piVar1 != 0x22) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/strtoull.c, line %d - %s\n"
           ,0x53,"errno == ERANGE");
  }
  if ((long)local_58 - (long)local_48 != 0x35) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/strtoull.c, line %d - %s\n"
           ,0x54,"( endptr - overflow ) == 53");
  }
  uVar2 = strtoull(local_48,&local_58,10);
  if (uVar2 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/strtoull.c, line %d - %s\n"
           ,0x58,"strtoull( overflow, &endptr, 10 ) == 0");
  }
  if (local_58 != local_48) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/strtoull.c, line %d - %s\n"
           ,0x59,"endptr == overflow");
  }
  local_58 = (char *)0x0;
  uVar2 = strtoull(local_48,&local_58,0);
  if (uVar2 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/strtoull.c, line %d - %s\n"
           ,0x5b,"strtoull( overflow, &endptr, 0 ) == 0");
  }
  if (local_58 != local_48) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/strtoull.c, line %d - %s\n"
           ,0x5c,"endptr == overflow");
  }
  *piVar1 = 0;
  uVar2 = strtoull("18446744073709551616",(char **)0x0,0);
  if (uVar2 != 0xffffffffffffffff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/strtoull.c, line %d - %s\n"
           ,99,"strtoull( \"18446744073709551616\", NULL, 0 ) == ULLONG_MAX");
  }
  if (*piVar1 != 0x22) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/strtoull.c, line %d - %s\n"
           ,100,"errno == ERANGE");
  }
  *piVar1 = 0;
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    char * endptr;
    /* this, to base 36, overflows even a 256 bit integer */
    char overflow[] = "-ZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZZ_";
    /* tricky border case */
    char tricky[] = "+0xz";
    errno = 0;
    /* basic functionality */
    TESTCASE( strtoull( "123", NULL, 10 ) == 123 );
    /* proper detecting of default base 10 */
    TESTCASE( strtoull( "456", NULL, 0 ) == 456 );
    /* proper functioning to smaller base */
    TESTCASE( strtoull( "14", NULL, 8 ) == 12 );
    /* proper autodetecting of octal */
    TESTCASE( strtoull( "016", NULL, 0 ) == 14 );
    /* proper autodetecting of hexadecimal, lowercase 'x' */
    TESTCASE( strtoull( "0xFF", NULL, 0 ) == 255 );
    /* proper autodetecting of hexadecimal, uppercase 'X' */
    TESTCASE( strtoull( "0Xa1", NULL, 0 ) == 161 );
    /* proper handling of border case: 0x followed by non-hexdigit */
    TESTCASE( strtoull( tricky, &endptr, 0 ) == 0 );
    /* newlib completely balks at this parse, so we _NOREG it */
    TESTCASE_NOREG( endptr == tricky + 2 );
    /* proper handling of border case: 0 followed by non-octdigit */
    TESTCASE( strtoull( tricky, &endptr, 8 ) == 0 );
    TESTCASE( endptr == tricky + 2 );
    /* errno should still be 0 */
    TESTCASE( errno == 0 );
    /* correctly decoding zero */
    TESTCASE( strtoull( "0", &endptr, 0 ) == 0 );
    TESTCASE( *endptr == '\0' );
    TESTCASE( errno == 0 );
    /* overflowing subject sequence must still return proper endptr */
    TESTCASE( strtoull( overflow, &endptr, 36 ) == ULLONG_MAX );
    TESTCASE( errno == ERANGE );
    TESTCASE( ( endptr - overflow ) == 53 );
    /* same for positive */
    errno = 0;
    TESTCASE( strtoull( overflow + 1, &endptr, 36 ) == ULLONG_MAX );
    TESTCASE( errno == ERANGE );
    TESTCASE( ( endptr - overflow ) == 53 );
    /* testing skipping of leading whitespace */
    TESTCASE( strtoull( " \n\v\t\f789", NULL, 0 ) == 789 );
    /* testing conversion failure */
    TESTCASE( strtoull( overflow, &endptr, 10 ) == 0 );
    TESTCASE( endptr == overflow );
    endptr = NULL;
    TESTCASE( strtoull( overflow, &endptr, 0 ) == 0 );
    TESTCASE( endptr == overflow );
    errno = 0;
    /* long long -> 64 bit */
#if ULLONG_MAX >> 63 == 1
    /* testing "even" overflow, i.e. base is power of two */
    TESTCASE( strtoull( "18446744073709551615", NULL, 0 ) == ULLONG_MAX );
    TESTCASE( errno == 0 );
    TESTCASE( strtoull( "18446744073709551616", NULL, 0 ) == ULLONG_MAX );
    TESTCASE( errno == ERANGE );
    /* TODO: test "odd" overflow, i.e. base is not power of two */
    /* long long -> 128 bit */
#elif ULLONG_MAX >> 127 == 1
    /* testing "even" overflow, i.e. base is power of two */
    TESTCASE( strtoull( "340282366920938463463374607431768211455", NULL, 0 ) == ULLONG_MAX );
    TESTCASE( errno == 0 );
    TESTCASE( strtoull( "340282366920938463463374607431768211456", NULL, 0 ) == ULLONG_MAX );
    TESTCASE( errno == ERANGE );
    /* TODO: test "odd" overflow, i.e. base is not power of two */
#else
#error Unsupported width of 'long long' (neither 64 nor 128 bit).
#endif
    errno = 0;
    TESTCASE( strtoull( "-1", NULL, 0 ) == ULLONG_MAX );
    TESTCASE( errno == 0 );
    return TEST_RESULTS;
}